

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fspec.cc
# Opt level: O3

int4 __thiscall ParamEntry::justifiedContain(ParamEntry *this,Address *addr,int4 sz)

{
  int *piVar1;
  undefined8 *puVar2;
  JoinRecord *pJVar3;
  pointer pVVar4;
  ulong uVar5;
  ulong uVar6;
  int4 iVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  Address entry;
  Address local_40;
  
  pJVar3 = this->joinrec;
  if (pJVar3 == (JoinRecord *)0x0) {
    uVar12 = (ulong)this->alignment;
    if (uVar12 == 0) {
      local_40.base = this->spaceid;
      local_40.offset = this->addressbase;
      iVar8 = Address::justifiedContain(&local_40,this->size,addr,sz,(bool)((byte)this->flags & 1));
    }
    else {
      iVar8 = -1;
      if (this->spaceid == addr->base) {
        uVar5 = addr->offset;
        uVar6 = this->addressbase;
        if (((uVar6 <= uVar5) && (uVar9 = ((long)sz - 1U) + uVar5, !CARRY8((long)sz - 1U,uVar5))) &&
           (uVar9 <= ((long)this->size + uVar6) - 1)) {
          if (((this->flags & 1) == 0) && ((this->spaceid->flags & 1) != 0)) {
            iVar10 = (int)(((uVar9 - uVar6) + 1) % uVar12);
            iVar8 = this->alignment - iVar10;
            if (iVar10 == 0) {
              iVar8 = 0;
            }
          }
          else {
            iVar8 = (int)((uVar5 - uVar6) % uVar12);
          }
        }
      }
    }
  }
  else {
    uVar12 = ((long)(pJVar3->pieces).super__Vector_base<VarnodeData,_std::allocator<VarnodeData>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(pJVar3->pieces).super__Vector_base<VarnodeData,_std::allocator<VarnodeData>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    iVar11 = (int)uVar12 + 1;
    lVar13 = (uVar12 & 0xffffffff) * 0x18 + -8;
    iVar10 = 0;
    do {
      iVar8 = iVar10;
      iVar11 = iVar11 + -1;
      if (iVar11 < 1) {
        return -1;
      }
      pVVar4 = (this->joinrec->pieces).super__Vector_base<VarnodeData,_std::allocator<VarnodeData>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar2 = (undefined8 *)((long)pVVar4 + lVar13 + -0x10);
      local_40.base = (AddrSpace *)*puVar2;
      local_40.offset = puVar2[1];
      iVar7 = Address::justifiedContain
                        (&local_40,*(int4 *)((long)&pVVar4->space + lVar13),addr,sz,false);
      piVar1 = (int *)((long)&pVVar4->space + lVar13);
      lVar13 = lVar13 + -0x18;
      iVar10 = *piVar1 + iVar8;
    } while (iVar7 < 0);
    iVar8 = iVar7 + iVar8;
  }
  return iVar8;
}

Assistant:

int4 ParamEntry::justifiedContain(const Address &addr,int4 sz) const

{
  if (joinrec != (JoinRecord *)0) {
    int4 res = 0;
    for(int4 i=joinrec->numPieces()-1;i>=0;--i) { // Move from least significant to most
      const VarnodeData &vdata(joinrec->getPiece(i));
      int4 cur = vdata.getAddr().justifiedContain(vdata.size,addr,sz,false);
      if (cur<0)
	res += vdata.size;	// We skipped this many less significant bytes
      else {
	return res + cur;
      }
    }
    return -1;			// Not contained at all
  }
  if (alignment==0) {
    // Ordinary endian containment
    Address entry(spaceid,addressbase);
    return entry.justifiedContain(size,addr,sz,((flags&force_left_justify)!=0));
  }
  if (spaceid != addr.getSpace()) return -1;
  uintb startaddr = addr.getOffset();
  if (startaddr < addressbase) return -1;
  uintb endaddr = startaddr + sz - 1;
  if (endaddr < startaddr) return -1; // Don't allow wrap around
  if (endaddr > (addressbase+size-1)) return -1;
  startaddr -= addressbase;
  endaddr -= addressbase;
  if (!isLeftJustified()) {   // For right justified (big endian), endaddr must be aligned
    int4 res = (int4)((endaddr+1) % alignment);
    if (res==0) return 0;
    return (alignment-res);
  }
  return (int4)(startaddr % alignment);
}